

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

bool isRotationMatrix(Mat *R)

{
  _InputArray *p_Var1;
  double dVar2;
  Mat shouldBeIdentity;
  Mat I;
  Mat Rt;
  _InputArray local_2b0;
  _OutputArray local_298 [4];
  Mat local_238 [96];
  Mat local_1d8 [96];
  undefined1 local_178 [16];
  Size local_168;
  Mat local_108 [96];
  Mat local_a8 [144];
  
  cv::Mat::Mat(local_1d8);
  local_168.width = 0;
  local_168.height = 0;
  local_178._0_4_ = 0x1010000;
  local_298[0].super__InputArray.sz.width = 0;
  local_298[0].super__InputArray.sz.height = 0;
  local_298[0].super__InputArray.flags = 0x2010000;
  local_298[0].super__InputArray.obj = local_1d8;
  local_178._8_8_ = R;
  cv::transpose((_InputArray *)local_178,local_298);
  cv::operator*((Mat *)local_178,local_1d8);
  cv::Mat::Mat((Mat *)local_298);
  (**(code **)(*(long *)CONCAT44(local_178._4_4_,local_178._0_4_) + 0x18))
            ((long *)CONCAT44(local_178._4_4_,local_178._0_4_),local_178,(Mat *)local_298,0xffffffff
            );
  cv::Mat::~Mat(local_a8);
  cv::Mat::~Mat(local_108);
  cv::Mat::~Mat((Mat *)(local_178 + 0x10));
  cv::Mat::eye((int)local_178,3,3);
  cv::Mat::Mat(local_238);
  (**(code **)(*(long *)CONCAT44(local_178._4_4_,local_178._0_4_) + 0x18))
            ((long *)CONCAT44(local_178._4_4_,local_178._0_4_),local_178,local_238,0xffffffff);
  cv::Mat::~Mat(local_a8);
  cv::Mat::~Mat(local_108);
  cv::Mat::~Mat((Mat *)(local_178 + 0x10));
  local_168.width = 0;
  local_168.height = 0;
  local_178._0_4_ = 0x1010000;
  local_2b0.sz.width = 0;
  local_2b0.sz.height = 0;
  local_2b0.flags = 0x1010000;
  local_2b0.obj = (Mat *)local_298;
  local_178._8_8_ = local_238;
  p_Var1 = (_InputArray *)cv::noArray();
  dVar2 = (double)cv::norm((_InputArray *)local_178,&local_2b0,4,p_Var1);
  cv::Mat::~Mat(local_238);
  cv::Mat::~Mat((Mat *)local_298);
  cv::Mat::~Mat(local_1d8);
  return dVar2 < 1e-06;
}

Assistant:

bool isRotationMatrix(cv::Mat &R)
{
    cv::Mat Rt;
    transpose(R, Rt);
    cv::Mat shouldBeIdentity = Rt * R;
    cv::Mat I = cv::Mat::eye(3,3, shouldBeIdentity.type());
     
    return  norm(I, shouldBeIdentity) < 1e-6;
     
}